

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PagerUnrefNotNull(DbPage *pPg)

{
  Pager *pPager_00;
  Pager *pPager;
  DbPage *pPg_local;
  
  pPager_00 = pPg->pPager;
  if ((pPg->flags & 0x20) == 0) {
    sqlite3PcacheRelease(pPg);
  }
  else {
    pagerReleaseMapPage(pPg);
  }
  pagerUnlockIfUnused(pPager_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefNotNull(DbPage *pPg){
  Pager *pPager;
  assert( pPg!=0 );
  pPager = pPg->pPager;
  if( pPg->flags & PGHDR_MMAP ){
    pagerReleaseMapPage(pPg);
  }else{
    sqlite3PcacheRelease(pPg);
  }
  pagerUnlockIfUnused(pPager);
}